

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vvcStreamReader.cpp
# Opt level: O2

int __thiscall
VVCStreamReader::writeAdditionData
          (VVCStreamReader *this,uint8_t *dstBuffer,uint8_t *dstEnd,AVPacket *avPacket,
          PriorityDataInfo *priorityData)

{
  int iVar1;
  uint8_t *__src;
  uint8_t *puVar2;
  size_t __n;
  
  __n = (size_t)avPacket->size;
  puVar2 = dstBuffer;
  if (((4 < (long)__n) && ((long)__n < (long)dstEnd - (long)dstBuffer)) &&
     (__src = avPacket->data, (__src[4 - (ulong)(__src[2] == '\x01')] & 0x7e) == 0x28)) {
    memcpy(dstBuffer,__src,__n);
    iVar1 = avPacket->size;
    avPacket->size = 0;
    puVar2 = dstBuffer + iVar1;
    avPacket->data = (uint8_t *)0x0;
  }
  if (((avPacket->flags & 0x20) == 0 & this->m_firstFileFrame) == 1) {
    avPacket->flags = avPacket->flags | 0x20;
    puVar2 = writeBuffer(this,&this->m_vpsBuffer,puVar2,dstEnd);
    puVar2 = writeBuffer(this,&this->m_spsBuffer,puVar2,dstEnd);
    puVar2 = writeBuffer(this,&this->m_ppsBuffer,puVar2,dstEnd);
  }
  this->m_firstFileFrame = false;
  return (int)puVar2 - (int)dstBuffer;
}

Assistant:

int VVCStreamReader::writeAdditionData(uint8_t* dstBuffer, uint8_t* dstEnd, AVPacket& avPacket,
                                       PriorityDataInfo* priorityData)
{
    uint8_t* curPos = dstBuffer;

    if (avPacket.size > 4 && avPacket.size < dstEnd - dstBuffer)
    {
        const int offset = avPacket.data[2] == 1 ? 3 : 4;
        const auto nalType = static_cast<VvcUnit::NalType>((avPacket.data[offset] >> 1) & 0x3f);
        if (nalType == VvcUnit::NalType::AUD)
        {
            // place delimiter at first place
            memcpy(curPos, avPacket.data, avPacket.size);
            curPos += avPacket.size;
            avPacket.size = 0;
            avPacket.data = nullptr;
        }
    }

    const bool needInsSpsPps = m_firstFileFrame && !(avPacket.flags & AVPacket::IS_SPS_PPS_IN_GOP);
    if (needInsSpsPps)
    {
        avPacket.flags |= AVPacket::IS_SPS_PPS_IN_GOP;

        curPos = writeBuffer(m_vpsBuffer, curPos, dstEnd);
        curPos = writeBuffer(m_spsBuffer, curPos, dstEnd);
        curPos = writeBuffer(m_ppsBuffer, curPos, dstEnd);
    }

    m_firstFileFrame = false;
    return static_cast<int>(curPos - dstBuffer);
}